

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

bool __thiscall BaseIndex::Init(BaseIndex *this)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  Chainstate *pCVar4;
  pointer pCVar5;
  bilingual_str *fmt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  CBlockIndex *__a;
  __pointer_type pCVar6;
  long *in_RDI;
  long in_FS_OFFSET;
  CBlockIndex *start_block;
  CBlockIndex *locator_index;
  CChain *index_chain;
  CBlockLocator locator;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock10;
  undefined4 in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  CBlockLocator *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  memory_order in_stack_fffffffffffffe1c;
  BaseIndex *in_stack_fffffffffffffe20;
  BlockManager *in_stack_fffffffffffffe28;
  undefined6 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe36;
  undefined1 in_stack_fffffffffffffe37;
  ValidationSignals *in_stack_fffffffffffffe38;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffe40;
  string *original;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffffe48;
  char *__s;
  undefined7 in_stack_fffffffffffffe60;
  bool local_12a;
  string local_129 [2];
  int local_d4;
  optional<interfaces::BlockRef> local_d0 [5];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            ((char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
             (char *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,(RecursiveMutex *)0x91a7f5)
  ;
  CThreadInterrupt::reset
            ((CThreadInterrupt *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  pCVar4 = Init::anon_class_8_1_8991fb9c::operator()
                     ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffe38);
  in_RDI[0x11] = (long)pCVar4;
  pCVar5 = std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::operator->
                     ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                      CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  (*pCVar5->_vptr_Chain[0x36])();
  std::unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_>::operator->
            ((unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  ValidationSignals::RegisterValidationInterface
            (in_stack_fffffffffffffe38,
             (CValidationInterface *)
             CONCAT17(in_stack_fffffffffffffe37,
                      CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)));
  CBlockLocator::CBlockLocator
            ((CBlockLocator *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  (**(code **)(*in_RDI + 0x78))();
  bVar1 = DB::ReadBestBlock((DB *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                            in_stack_fffffffffffffe10);
  if (!bVar1) {
    CBlockLocator::SetNull
              ((CBlockLocator *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  }
  fmt = (bilingual_str *)
        MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                  ((AnnotatedMixin<std::recursive_mutex> *)
                   CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
             (char *)CONCAT17(in_stack_fffffffffffffe37,
                              CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
             (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffe28 >> 0x18,0));
  uVar2 = CBlockLocator::IsNull
                    ((CBlockLocator *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08))
  ;
  if ((bool)uVar2) {
    SetBestBlockIndex(in_stack_fffffffffffffe20,
                      (CBlockIndex *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  }
  else {
    __s = *(char **)(in_RDI[0x11] + 0x48);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::vector<uint256,_std::allocator<uint256>_>::at
                        ((vector<uint256,_std::allocator<uint256>_> *)
                         CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                         (size_type)in_stack_fffffffffffffe10);
    __a = ::node::BlockManager::LookupBlockIndex
                    (in_stack_fffffffffffffe28,(uint256 *)in_stack_fffffffffffffe20);
    if (__a == (CBlockIndex *)0x0) {
      original = local_129;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,__s,(allocator<char> *)__a);
      Untranslated(original);
      GetName_abi_cxx11_((BaseIndex *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08))
      ;
      tinyformat::format<std::__cxx11::string>
                (fmt,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar2,in_stack_fffffffffffffe60));
      local_12a = InitError((bilingual_str *)
                            CONCAT17(in_stack_fffffffffffffe37,
                                     CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)))
      ;
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      std::allocator<char>::~allocator((allocator<char> *)local_129);
      goto LAB_0091ac88;
    }
    SetBestBlockIndex(in_stack_fffffffffffffe20,
                      (CBlockIndex *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  }
  pCVar6 = std::atomic<const_CBlockIndex_*>::load
                     ((atomic<const_CBlockIndex_*> *)in_stack_fffffffffffffe20,
                      in_stack_fffffffffffffe1c);
  if (pCVar6 == (__pointer_type)0x0) {
    std::optional<interfaces::BlockRef>::optional(local_d0);
  }
  else {
    CBlockIndex::GetBlockHash
              ((CBlockIndex *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    local_d4 = pCVar6->nHeight;
    std::make_optional<interfaces::BlockRef>
              ((BlockRef *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  }
  bVar3 = (**(code **)(*in_RDI + 0x58))(in_RDI,local_d0);
  if (((bVar3 ^ 0xff) & 1) == 0) {
    CChain::Tip((CChain *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    std::atomic<bool>::operator=
              ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),false);
    std::atomic<bool>::operator=
              ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),false);
    local_12a = true;
  }
  else {
    local_12a = false;
  }
LAB_0091ac88:
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  CBlockLocator::~CBlockLocator
            ((CBlockLocator *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_12a;
  }
  __stack_chk_fail();
}

Assistant:

bool BaseIndex::Init()
{
    AssertLockNotHeld(cs_main);

    // May need reset if index is being restarted.
    m_interrupt.reset();

    // m_chainstate member gives indexing code access to node internals. It is
    // removed in followup https://github.com/bitcoin/bitcoin/pull/24230
    m_chainstate = WITH_LOCK(::cs_main,
        return &m_chain->context()->chainman->GetChainstateForIndexing());
    // Register to validation interface before setting the 'm_synced' flag, so that
    // callbacks are not missed once m_synced is true.
    m_chain->context()->validation_signals->RegisterValidationInterface(this);

    CBlockLocator locator;
    if (!GetDB().ReadBestBlock(locator)) {
        locator.SetNull();
    }

    LOCK(cs_main);
    CChain& index_chain = m_chainstate->m_chain;

    if (locator.IsNull()) {
        SetBestBlockIndex(nullptr);
    } else {
        // Setting the best block to the locator's top block. If it is not part of the
        // best chain, we will rewind to the fork point during index sync
        const CBlockIndex* locator_index{m_chainstate->m_blockman.LookupBlockIndex(locator.vHave.at(0))};
        if (!locator_index) {
            return InitError(strprintf(Untranslated("%s: best block of the index not found. Please rebuild the index."), GetName()));
        }
        SetBestBlockIndex(locator_index);
    }

    // Child init
    const CBlockIndex* start_block = m_best_block_index.load();
    if (!CustomInit(start_block ? std::make_optional(interfaces::BlockRef{start_block->GetBlockHash(), start_block->nHeight}) : std::nullopt)) {
        return false;
    }

    // Note: this will latch to true immediately if the user starts up with an empty
    // datadir and an index enabled. If this is the case, indexation will happen solely
    // via `BlockConnected` signals until, possibly, the next restart.
    m_synced = start_block == index_chain.Tip();
    m_init = true;
    return true;
}